

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void write_color(ostream *out,color *pixel_color)

{
  int iVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = pixel_color->e[0];
  dVar3 = pixel_color->e[1];
  dVar4 = pixel_color->e[2];
  dVar5 = 0.0;
  if (0.0 < dVar6) {
    if (dVar6 < 0.0) {
      dVar5 = sqrt(dVar6);
    }
    else {
      dVar5 = SQRT(dVar6);
    }
  }
  dVar6 = 0.0;
  if (0.0 < dVar3) {
    if (dVar3 < 0.0) {
      dVar6 = sqrt(dVar3);
    }
    else {
      dVar6 = SQRT(dVar3);
    }
  }
  dVar3 = 0.0;
  if (0.0 < dVar4) {
    if (dVar4 < 0.0) {
      dVar3 = sqrt(dVar4);
    }
    else {
      dVar3 = SQRT(dVar4);
    }
  }
  if (write_color(std::ostream&,vec3_const&)::intensity == '\0') {
    iVar1 = __cxa_guard_acquire(&write_color(std::ostream&,vec3_const&)::intensity);
    if (iVar1 != 0) {
      write_color::intensity = (interval)(ZEXT816(0x3feff7ced916872b) << 0x40);
      __cxa_guard_release(&write_color(std::ostream&,vec3_const&)::intensity);
    }
  }
  dVar4 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar5) &&
     (dVar4 = write_color::intensity.max, dVar5 <= write_color::intensity.max)) {
    dVar4 = dVar5;
  }
  dVar5 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar6) &&
     (dVar5 = write_color::intensity.max, dVar6 <= write_color::intensity.max)) {
    dVar5 = dVar6;
  }
  dVar6 = write_color::intensity.min;
  if ((write_color::intensity.min <= dVar3) &&
     (dVar6 = write_color::intensity.max, dVar3 <= write_color::intensity.max)) {
    dVar6 = dVar3;
  }
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)out,(int)(dVar4 * 256.0));
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)(dVar5 * 256.0));
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(int)(dVar6 * 256.0));
  std::operator<<(poVar2,'\n');
  return;
}

Assistant:

void write_color(std::ostream& out, const color& pixel_color) {
    auto r = pixel_color.x();
    auto g = pixel_color.y();
    auto b = pixel_color.z();

    // Apply a linear to gamma transform for gamma 2
    r = linear_to_gamma(r);
    g = linear_to_gamma(g);
    b = linear_to_gamma(b);

    // Translate the [0,1] component values to the byte range [0,255].
    static const interval intensity(0.000, 0.999);
    int rbyte = int(256 * intensity.clamp(r));
    int gbyte = int(256 * intensity.clamp(g));
    int bbyte = int(256 * intensity.clamp(b));

    // Write out the pixel color components.
    out << rbyte << ' ' << gbyte << ' ' << bbyte << '\n';
}